

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_hash.cpp
# Opt level: O3

int __thiscall
sc_core::sc_phash_base::remove_by_contents(sc_phash_base *this,void *c,_func_void_void_ptr *kfree)

{
  int iVar1;
  sc_phash_elem *psVar2;
  sc_phash_elem **ppsVar3;
  int iVar4;
  sc_phash_elem *p;
  long lVar5;
  
  iVar1 = this->num_bins;
  if (iVar1 < 1) {
    iVar4 = 0;
  }
  else {
    lVar5 = 0;
    iVar4 = 0;
    do {
      p = this->bins[lVar5];
      if (p != (sc_phash_elem *)0x0) {
        ppsVar3 = this->bins + lVar5;
        do {
          psVar2 = p->next;
          if (p->contents == c) {
            *ppsVar3 = psVar2;
            (*kfree)(p->key);
            sc_mempool::release(p,0x18);
            psVar2 = *ppsVar3;
            this->num_entries = this->num_entries + -1;
            iVar4 = iVar4 + 1;
          }
          else {
            ppsVar3 = &p->next;
          }
          p = psVar2;
        } while (psVar2 != (sc_phash_elem *)0x0);
        iVar1 = this->num_bins;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < iVar1);
  }
  return iVar4;
}

Assistant:

int
sc_phash_base::remove_by_contents( const void* c, void (*kfree)(void*) )
{
    sc_phash_elem** last;
    sc_phash_elem*  ptr;

    int num_removed = 0;
    for (int i = 0; i < num_bins; ++i) {
        last = &(bins[i]);
        ptr = *last;
        while (ptr != 0) {
            if (ptr->contents != c) {
                last = &(ptr->next);
                ptr  = *last;
            }
            else {
                *last = ptr->next;
                (*kfree)(ptr->key);
                delete ptr;
                ptr = *last;
                --num_entries;
                ++num_removed;
            }
        }
    }
    return num_removed;
}